

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O3

string * __thiscall
duckdb::StringUtil::
Format<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          LogicalType *params_2,LogicalType *params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6_00;
  undefined8 uVar2;
  undefined8 in_stack_fffffffffffffef8;
  _Alloc_hider _Var3;
  undefined1 in_stack_ffffffffffffff08 [24];
  _Alloc_hider _Var4;
  undefined1 in_stack_ffffffffffffff28 [24];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  LogicalType local_80;
  undefined1 local_68 [40];
  undefined1 local_40 [16];
  
  _Var4._M_p = &stack0xffffffffffffff30;
  pcVar1 = (fmt_str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff20,pcVar1,pcVar1 + fmt_str->_M_string_length);
  _Var3._M_p = &stack0xffffffffffffff10;
  pcVar1 = (params->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff00,pcVar1,pcVar1 + params->_M_string_length);
  LogicalType::LogicalType((LogicalType *)local_68,(LogicalType *)params_1);
  LogicalType::LogicalType(&local_80,params_2);
  local_a0[0] = local_90;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,*(long *)params_3,
             (long)&((params_3->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_ExtraTypeInfo + *(long *)params_3);
  local_c0[0] = local_b0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,*(long *)params_4._M_dataplus._M_p,
             *(long *)(params_4._M_dataplus._M_p + 8) + *(long *)params_4._M_dataplus._M_p);
  uVar2 = 0x1595d31;
  local_68._24_8_ = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_68 + 0x18),*(long *)params_4._M_string_length,
             *(long *)(params_4._M_string_length + 8) + *(long *)params_4._M_string_length);
  params_4_00._M_string_length = (size_type)(local_68 + 0x18);
  params_4_00._M_dataplus._M_p = (pointer)local_c0;
  params_4_00.field_2._M_allocated_capacity = uVar2;
  params_4_00.field_2._8_8_ = in_stack_fffffffffffffef8;
  params_5_00._M_string_length = in_stack_ffffffffffffff08._0_8_;
  params_5_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffff08._8_16_;
  params_5_00._M_dataplus._M_p = _Var3._M_p;
  params_6_00._M_string_length = in_stack_ffffffffffffff28._0_8_;
  params_6_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffff28._8_16_;
  params_6_00._M_dataplus._M_p = _Var4._M_p;
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(Exception *)this,(string *)&stack0xffffffffffffff20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,&local_80
             ,(LogicalType *)local_a0,params_4_00,params_5_00,params_6_00);
  if ((undefined1 *)local_68._24_8_ != local_40) {
    operator_delete((void *)local_68._24_8_);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0]);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  LogicalType::~LogicalType(&local_80);
  LogicalType::~LogicalType((LogicalType *)local_68);
  if (_Var3._M_p != &stack0xffffffffffffff10) {
    operator_delete(_Var3._M_p);
  }
  if (_Var4._M_p != &stack0xffffffffffffff30) {
    operator_delete(_Var4._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}